

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O1

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<std::__cxx11::string,std::__cxx11::string,int,unsigned_long>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
          unsigned_long *args_2)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostringstream *unaff_R15;
  
  lVar4 = idx << 5;
  bVar2 = false;
  do {
    pbVar1 = (sv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(sv->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= idx) {
LAB_003b1b47:
      if (bVar2) {
        ss = unaff_R15;
      }
      return ss;
    }
    iVar3 = ::std::__cxx11::string::compare((char *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
    if (iVar3 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ss,(v->_M_dataplus)._M_p,v->_M_string_length);
      format_sv_rec<std::__cxx11::string,int,unsigned_long>(ss,sv,idx + 1,args,args_1,args_2);
      goto LAB_003b1b47;
    }
    pbVar1 = (sv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ss,*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar4),
               *(long *)((long)&pbVar1->_M_string_length + lVar4));
    idx = idx + 1;
    if (!bVar2) {
      unaff_R15 = ss;
    }
    lVar4 = lVar4 + 0x20;
    bVar2 = true;
  } while( true );
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v, Rest const &...args) {
  if (idx >= sv.size()) {
    return ss;
  }

  if (sv[idx] == "{}") {
    ss << v;
    format_sv_rec(ss, sv, idx + 1, args...);
  } else {
    ss << sv[idx];
    format_sv_rec(ss, sv, idx + 1, v, args...);
  }

  return ss;
}